

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O0

void LEARNER::multiline_learn_or_predict<true>
               (multi_learner *base,multi_ex *examples,uint64_t offset,uint32_t id)

{
  example *peVar1;
  bool bVar2;
  reference ppeVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar4;
  reference pvVar5;
  reference ppeVar6;
  uint64_t in_RDX;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  size_t i;
  example *ec;
  iterator __end2;
  iterator __begin2;
  multi_ex *__range2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> saved_offsets;
  vector<example_*,_std::allocator<example_*>_> *in_stack_ffffffffffffff78;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
  *in_stack_ffffffffffffff80;
  value_type vVar7;
  vector<example_*,_std::allocator<example_*>_> *in_stack_ffffffffffffff88;
  learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *in_stack_ffffffffffffff90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_48;
  vector<example_*,_std::allocator<example_*>_> *local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  uint64_t local_18;
  vector<example_*,_std::allocator<example_*>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2e3dc7);
  local_40 = local_10;
  local_48._M_current =
       (example **)
       std::vector<example_*,_std::allocator<example_*>_>::begin(in_stack_ffffffffffffff78);
  std::vector<example_*,_std::allocator<example_*>_>::end(in_stack_ffffffffffffff78);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff80,
                       (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar2) break;
    ppeVar3 = __gnu_cxx::
              __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
              operator*(&local_48);
    peVar1 = *ppeVar3;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff90,
               (value_type_conflict2 *)in_stack_ffffffffffffff88);
    (peVar1->super_example_predict).ft_offset = local_18;
    __gnu_cxx::__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
    operator++(&local_48);
  }
  learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::learn
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(size_t)in_stack_ffffffffffffff80);
  pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  while( true ) {
    this = pvVar8;
    pvVar4 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             std::vector<example_*,_std::allocator<example_*>_>::size(local_10);
    if (pvVar4 <= pvVar8) break;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_38,(size_type)this);
    vVar7 = *pvVar5;
    ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        (local_10,(size_type)this);
    ((*ppeVar6)->super_example_predict).ft_offset = vVar7;
    pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             ((long)&(this->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start + 1);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this);
  return;
}

Assistant:

void multiline_learn_or_predict(multi_learner& base, multi_ex& examples, const uint64_t offset, const uint32_t id = 0)
{
  std::vector<uint64_t> saved_offsets;
  for (auto ec : examples)
  {
    saved_offsets.push_back(ec->ft_offset);
    ec->ft_offset = offset;
  }

  if (is_learn)
    base.learn(examples, id);
  else
    base.predict(examples, id);

  for (size_t i = 0; i < examples.size(); i++) examples[i]->ft_offset = saved_offsets[i];
}